

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getpeereid.c
# Opt level: O2

int getpeereid(int sock,uid_t *uid,gid_t *gid)

{
  int iVar1;
  int iVar2;
  socklen_t so_len;
  ucred peercred;
  
  so_len = 0xc;
  iVar1 = getsockopt(sock,1,0x11,&peercred,&so_len);
  iVar2 = -1;
  if ((iVar1 == 0) && (so_len == 0xc)) {
    *uid = peercred.uid;
    *gid = peercred.gid;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int
getpeereid(int sock, uid_t *uid, gid_t *gid)
{
#if defined(SO_PEERCRED)
	/* Linux: use getsockopt(SO_PEERCRED) */
	struct ucred peercred;
	socklen_t so_len = sizeof(peercred);

	if (getsockopt(sock, SOL_SOCKET, SO_PEERCRED, &peercred, &so_len) != 0
	    || so_len != sizeof(peercred))
		return -1;
	*uid = peercred.uid;
	*gid = peercred.gid;
	return 0;
#elif defined(LOCAL_PEERCRED)
	/* Debian with FreeBSD kernel: use getsockopt(LOCAL_PEERCRED) */
	struct xucred peercred;
	ACCEPT_TYPE_ARG3 so_len = sizeof(peercred);

	if (getsockopt(sock, 0, LOCAL_PEERCRED, &peercred, &so_len) != 0
	    || so_len != sizeof(peercred)
	    || peercred.cr_version != XUCRED_VERSION)
		return -1;
	*uid = peercred.cr_uid;
	*gid = peercred.cr_gid;
	return 0;
#elif defined(HAVE_GETPEERUCRED)
	/* Solaris: use getpeerucred() */
	ucred_t *ucred;

	ucred = NULL;		/* must be initialized to NULL */
	if (getpeerucred(sock, &ucred) == -1)
		return -1;

	*uid = ucred_geteuid(ucred);
	*gid = ucred_getegid(ucred);
	ucred_free(ucred);

	if (*uid == (uid_t) (-1) || *gid == (gid_t) (-1))
		return -1;
	return 0;
#else
	/* No implementation available on this platform */
	errno = ENOSYS;
	return -1;
#endif
}